

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QFlags<QtMocConstants::EnumFlags> * __thiscall
QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::operator[]
          (QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *this,QByteArray *key)

{
  bool bVar1;
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar2;
  pointer ppVar3;
  value_type *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_bool>
  pVar4;
  iterator i;
  QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> copy;
  map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
  *in_stack_ffffffffffffff58;
  QFlags<QtMocConstants::EnumFlags> *pQVar5;
  QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *in_stack_ffffffffffffff60;
  map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
  *this_00;
  pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *this_01;
  undefined1 local_54 [4];
  _Self local_50;
  _Self local_48;
  undefined1 *local_40 [5];
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40[0] = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff60->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff60,
         (QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)in_stack_ffffffffffffff58);
  }
  else {
    memset(local_40,0,8);
    QMap((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)0x114403);
  }
  detach(in_stack_ffffffffffffff60);
  local_48._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
                *)0x114423);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x114434);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
                *)0x114443);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::operator==(&local_48,&local_50);
  if (bVar1) {
    pQVar2 = QtPrivate::
             QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
             ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>_>
                           *)0x114476);
    this_01 = (pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)&pQVar2->m;
    local_54 = (undefined1  [4])0x0;
    this_00 = (map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
               *)local_54;
    QFlags<QtMocConstants::EnumFlags>::QFlags((QFlags<QtMocConstants::EnumFlags> *)0x1144a0);
    std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::
    pair<QFlags<QtMocConstants::EnumFlags>,_true>
              (this_01,(QByteArray *)this_00,(QFlags<QtMocConstants::EnumFlags> *)in_RSI);
    pVar4 = std::
            map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
            ::insert(this_00,in_RSI);
    local_48._M_node = (_Base_ptr)pVar4.first._M_node;
    local_10 = pVar4.second;
    local_18 = local_48._M_node;
    std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::~pair
              ((pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)0x114500);
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>
                         *)0x11450a);
  pQVar5 = &ppVar3->second;
  ~QMap((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)0x11451c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }